

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O2

void Saig_ManCbaStop(Saig_ManCba_t *p)

{
  Vec_Int_t *__ptr;
  
  Vec_VecFreeP(&p->vReg2Frame);
  Vec_VecFreeP(&p->vReg2Value);
  Aig_ManStopP(&p->pFrames);
  __ptr = p->vMapPiF2A;
  if (__ptr != (Vec_Int_t *)0x0) {
    if (__ptr->pArray != (int *)0x0) {
      free(__ptr->pArray);
      p->vMapPiF2A->pArray = (int *)0x0;
      __ptr = p->vMapPiF2A;
      if (__ptr == (Vec_Int_t *)0x0) goto LAB_004f267c;
    }
    free(__ptr);
  }
LAB_004f267c:
  free(p);
  return;
}

Assistant:

void Saig_ManCbaStop( Saig_ManCba_t * p )
{
    Vec_VecFreeP( &p->vReg2Frame );
    Vec_VecFreeP( &p->vReg2Value );
    Aig_ManStopP( &p->pFrames );
    Vec_IntFreeP( &p->vMapPiF2A );
    ABC_FREE( p );
}